

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O0

int formparse(OperationConfig *config,char *input,curl_mime **mimepost,curl_mime **mimecurrent,
             _Bool literal_value)

{
  int iVar1;
  int iVar2;
  CURLcode CVar3;
  curl_mime *pcVar4;
  char *__s1;
  curl_mime *local_98;
  curl_mime *subparts_1;
  curl_mime *subparts;
  int sep;
  CURLcode res;
  curl_mimepart *part;
  curl_slist *headers;
  char *encoder;
  char *filename;
  char *type;
  char *data;
  char *contp;
  char *contents;
  char *name;
  curl_mime **ppcStack_30;
  _Bool literal_value_local;
  curl_mime **mimecurrent_local;
  curl_mime **mimepost_local;
  char *input_local;
  OperationConfig *config_local;
  
  contents = (char *)0x0;
  contp = (char *)0x0;
  filename = (char *)0x0;
  encoder = (char *)0x0;
  headers = (curl_slist *)0x0;
  part = (curl_mimepart *)0x0;
  _sep = (curl_mimepart *)0x0;
  name._7_1_ = literal_value;
  ppcStack_30 = mimecurrent;
  mimecurrent_local = mimepost;
  mimepost_local = (curl_mime **)input;
  input_local = (char *)config;
  if (*mimepost == (curl_mime *)0x0) {
    pcVar4 = (curl_mime *)curl_mime_init(config->easy);
    *mimecurrent_local = pcVar4;
    if (*mimecurrent_local == (curl_mime *)0x0) {
      warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_init failed!\n");
      return 1;
    }
    *ppcStack_30 = *mimecurrent_local;
  }
  contp = strdup((char *)mimepost_local);
  if (contp == (char *)0x0) {
    curl_mfprintf(*(undefined8 *)(*(long *)(input_local + 0x488) + 0x10),"out of memory\n");
    config_local._4_4_ = 2;
  }
  else {
    data = strchr(contp,0x3d);
    if (data == (char *)0x0) {
      warnf(*(GlobalConfig **)(input_local + 0x488),"Illegally formatted input field!\n");
      free(contp);
      config_local._4_4_ = 0x20;
    }
    else {
      subparts._0_4_ = 0;
      if (contp < data) {
        contents = contp;
      }
      __s1 = data + 1;
      *data = '\0';
      data = __s1;
      if ((*__s1 == '(') && ((name._7_1_ & 1) == 0)) {
        iVar1 = get_param_part((OperationConfig *)input_local,'\0',&data,&type,&filename,
                               (char **)0x0,(char **)0x0,(curl_slist **)&part);
        if (iVar1 < 0) {
          free(contp);
          return 3;
        }
        pcVar4 = (curl_mime *)curl_mime_init(*(undefined8 *)input_local);
        if (pcVar4 == (curl_mime *)0x0) {
          warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_init failed!\n");
          curl_slist_free_all(part);
          free(contp);
          return 4;
        }
        _sep = (curl_mimepart *)curl_mime_addpart(*ppcStack_30);
        if (_sep == (curl_mimepart *)0x0) {
          warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_addpart failed!\n");
          curl_mime_free(pcVar4);
          curl_slist_free_all(part);
          free(contp);
          return 5;
        }
        iVar1 = curl_mime_subparts(_sep,pcVar4);
        if (iVar1 != 0) {
          warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_subparts failed!\n");
          curl_mime_free(pcVar4);
          curl_slist_free_all(part);
          free(contp);
          return 6;
        }
        *ppcStack_30 = pcVar4;
        iVar1 = curl_mime_headers(_sep,part,1);
        if (iVar1 != 0) {
          warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_headers failed!\n");
          curl_slist_free_all(part);
          free(contp);
          return 7;
        }
        iVar1 = curl_mime_type(_sep,filename);
        if (iVar1 != 0) {
          warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_type failed!\n");
          free(contp);
          return 8;
        }
      }
      else if ((contents == (char *)0x0) &&
              ((iVar1 = strcmp(__s1,")"), iVar1 == 0 && ((name._7_1_ & 1) == 0)))) {
        if (*ppcStack_30 == *mimecurrent_local) {
          warnf(*(GlobalConfig **)(input_local + 0x488),"no multipart to terminate!\n");
          free(contp);
          return 9;
        }
        *ppcStack_30 = (*ppcStack_30)->parent->parent;
      }
      else if ((*data == '@') && ((name._7_1_ & 1) == 0)) {
        local_98 = (curl_mime *)0x0;
        do {
          data = data + 1;
          iVar1 = get_param_part((OperationConfig *)input_local,',',&data,&type,&filename,&encoder,
                                 (char **)&headers,(curl_slist **)&part);
          if (iVar1 < 0) {
            if (local_98 != *ppcStack_30) {
              curl_mime_free(local_98);
            }
            free(contp);
            return 10;
          }
          if (local_98 == (curl_mime *)0x0) {
            if (iVar1 == 0x2c) {
              local_98 = (curl_mime *)curl_mime_init(*(undefined8 *)input_local);
              if (local_98 == (curl_mime *)0x0) {
                warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_init failed!\n");
                curl_slist_free_all(part);
                free(contp);
                return 0xb;
              }
            }
            else {
              local_98 = *ppcStack_30;
            }
          }
          _sep = (curl_mimepart *)curl_mime_addpart(local_98);
          if (_sep == (curl_mimepart *)0x0) {
            warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_addpart failed!\n");
            if (local_98 != *ppcStack_30) {
              curl_mime_free(local_98);
            }
            curl_slist_free_all(part);
            free(contp);
            return 0xc;
          }
          iVar2 = curl_mime_headers(_sep,part,1);
          if (iVar2 != 0) {
            warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_headers failed!\n");
            if (local_98 != *ppcStack_30) {
              curl_mime_free(local_98);
            }
            curl_slist_free_all(part);
            free(contp);
            return 0xd;
          }
          CVar3 = file_or_stdin(_sep,type);
          if ((CVar3 != CURLE_OK) &&
             (warnf(*(GlobalConfig **)(input_local + 0x488),"setting file %s  failed!\n",type),
             CVar3 != CURLE_READ_ERROR)) {
            if (local_98 != *ppcStack_30) {
              curl_mime_free(local_98);
            }
            free(contp);
            return 0xe;
          }
          if ((encoder != (char *)0x0) && (iVar2 = curl_mime_filename(_sep,encoder), iVar2 != 0)) {
            warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_filename failed!\n");
            if (local_98 != *ppcStack_30) {
              curl_mime_free(local_98);
            }
            free(contp);
            return 0xf;
          }
          iVar2 = curl_mime_type(_sep,filename);
          if (iVar2 != 0) {
            warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_type failed!\n");
            if (local_98 != *ppcStack_30) {
              curl_mime_free(local_98);
            }
            free(contp);
            return 0x10;
          }
          iVar2 = curl_mime_encoder(_sep,headers);
          if (iVar2 != 0) {
            warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_encoder failed!\n");
            if (local_98 != *ppcStack_30) {
              curl_mime_free(local_98);
            }
            free(contp);
            return 0x11;
          }
        } while (iVar1 != 0);
        if (local_98 != *ppcStack_30) {
          _sep = (curl_mimepart *)curl_mime_addpart(*ppcStack_30);
          if (_sep == (curl_mimepart *)0x0) {
            warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_addpart failed!\n");
            curl_mime_free(local_98);
            free(contp);
            return 0x12;
          }
          iVar1 = curl_mime_subparts(_sep,local_98);
          if (iVar1 != 0) {
            warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_subparts failed!\n");
            curl_mime_free(local_98);
            free(contp);
            return 0x13;
          }
        }
      }
      else {
        _sep = (curl_mimepart *)curl_mime_addpart(*ppcStack_30);
        if (_sep == (curl_mimepart *)0x0) {
          warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_addpart failed!\n");
          free(contp);
          return 0x14;
        }
        if ((*data == '<') && ((name._7_1_ & 1) == 0)) {
          data = data + 1;
          subparts._0_4_ =
               get_param_part((OperationConfig *)input_local,'\0',&data,&type,&filename,(char **)0x0
                              ,(char **)&headers,(curl_slist **)&part);
          if ((int)subparts < 0) {
            free(contp);
            return 0x15;
          }
          iVar1 = curl_mime_headers(_sep,part,1);
          if (iVar1 != 0) {
            warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_headers failed!\n");
            curl_slist_free_all(part);
            free(contp);
            return 0x16;
          }
          CVar3 = file_or_stdin(_sep,type);
          if ((CVar3 != CURLE_OK) &&
             (warnf(*(GlobalConfig **)(input_local + 0x488),"setting file %s failed!\n",type),
             CVar3 != CURLE_READ_ERROR)) {
            free(contp);
            return 0x17;
          }
        }
        else {
          if ((name._7_1_ & 1) == 0) {
            subparts._0_4_ =
                 get_param_part((OperationConfig *)input_local,'\0',&data,&type,&filename,&encoder,
                                (char **)&headers,(curl_slist **)&part);
            if ((int)subparts < 0) {
              free(contp);
              return 0x18;
            }
          }
          else {
            type = data;
          }
          iVar1 = curl_mime_headers(_sep,part,1);
          if (iVar1 != 0) {
            warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_headers failed!\n");
            curl_slist_free_all(part);
            free(contp);
            return 0x19;
          }
          iVar1 = curl_mime_data(_sep,type,0xffffffffffffffff);
          if (iVar1 != 0) {
            warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_data failed!\n");
            free(contp);
            return 0x1b;
          }
        }
        iVar1 = curl_mime_filename(_sep,encoder);
        if (iVar1 != 0) {
          warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_filename failed!\n");
          free(contp);
          return 0x1c;
        }
        iVar1 = curl_mime_type(_sep,filename);
        if (iVar1 != 0) {
          warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_type failed!\n");
          free(contp);
          return 0x1d;
        }
        iVar1 = curl_mime_encoder(_sep,headers);
        if (iVar1 != 0) {
          warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_encoder failed!\n");
          free(contp);
          return 0x1e;
        }
        if ((int)subparts != 0) {
          *data = (char)(int)subparts;
          warnf(*(GlobalConfig **)(input_local + 0x488),
                "garbage at end of field specification: %s\n",data);
        }
      }
      if ((contents == (char *)0x0) || (iVar1 = curl_mime_name(_sep,contents), iVar1 == 0)) {
        free(contp);
        config_local._4_4_ = 0;
      }
      else {
        warnf(*(GlobalConfig **)(input_local + 0x488),"curl_mime_name failed!\n");
        free(contp);
        config_local._4_4_ = 0x1f;
      }
    }
  }
  return config_local._4_4_;
}

Assistant:

int formparse(struct OperationConfig *config,
              const char *input,
              curl_mime **mimepost,
              curl_mime **mimecurrent,
              bool literal_value)
{
  /* input MUST be a string in the format 'name=contents' and we'll
     build a linked list with the info */
  char *name = NULL;
  char *contents = NULL;
  char *contp;
  char *data;
  char *type = NULL;
  char *filename = NULL;
  char *encoder = NULL;
  struct curl_slist *headers = NULL;
  curl_mimepart *part = NULL;
  CURLcode res;

  /* Allocate the main mime structure if needed. */
  if(!*mimepost) {
    *mimepost = curl_mime_init(config->easy);
    if(!*mimepost) {
      warnf(config->global, "curl_mime_init failed!\n");
      return 1;
    }
    *mimecurrent = *mimepost;
  }

  /* Make a copy we can overwrite. */
  contents = strdup(input);
  if(!contents) {
    fprintf(config->global->errors, "out of memory\n");
    return 2;
  }

  /* Scan for the end of the name. */
  contp = strchr(contents, '=');
  if(contp) {
    int sep = '\0';
    if(contp > contents)
      name = contents;
    *contp++ = '\0';

    if(*contp == '(' && !literal_value) {
      curl_mime *subparts;

      /* Starting a multipart. */
      sep = get_param_part(config, '\0',
                           &contp, &data, &type, NULL, NULL, &headers);
      if(sep < 0) {
        Curl_safefree(contents);
        return 3;
      }
      subparts = curl_mime_init(config->easy);
      if(!subparts) {
        warnf(config->global, "curl_mime_init failed!\n");
        curl_slist_free_all(headers);
        Curl_safefree(contents);
        return 4;
      }
      part = curl_mime_addpart(*mimecurrent);
      if(!part) {
        warnf(config->global, "curl_mime_addpart failed!\n");
        curl_mime_free(subparts);
        curl_slist_free_all(headers);
        Curl_safefree(contents);
        return 5;
      }
      if(curl_mime_subparts(part, subparts)) {
        warnf(config->global, "curl_mime_subparts failed!\n");
        curl_mime_free(subparts);
        curl_slist_free_all(headers);
        Curl_safefree(contents);
        return 6;
      }
      *mimecurrent = subparts;
      if(curl_mime_headers(part, headers, 1)) {
        warnf(config->global, "curl_mime_headers failed!\n");
        curl_slist_free_all(headers);
        Curl_safefree(contents);
        return 7;
      }
      if(curl_mime_type(part, type)) {
        warnf(config->global, "curl_mime_type failed!\n");
        Curl_safefree(contents);
        return 8;
      }
    }
    else if(!name && !strcmp(contp, ")") && !literal_value) {
      /* Ending a mutipart. */
      if(*mimecurrent == *mimepost) {
        warnf(config->global, "no multipart to terminate!\n");
        Curl_safefree(contents);
        return 9;
        }
      *mimecurrent = (*mimecurrent)->parent->parent;
    }
    else if('@' == contp[0] && !literal_value) {

      /* we use the @-letter to indicate file name(s) */

      curl_mime *subparts = NULL;

      do {
        /* since this was a file, it may have a content-type specifier
           at the end too, or a filename. Or both. */
        ++contp;
        sep = get_param_part(config, ',', &contp,
                             &data, &type, &filename, &encoder, &headers);
        if(sep < 0) {
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          Curl_safefree(contents);
          return 10;
        }

        /* now contp point to comma or string end.
           If more files to come, make sure we have multiparts. */
        if(!subparts) {
          if(sep != ',')    /* If there is a single file. */
            subparts = *mimecurrent;
          else {
            subparts = curl_mime_init(config->easy);
            if(!subparts) {
              warnf(config->global, "curl_mime_init failed!\n");
              curl_slist_free_all(headers);
              Curl_safefree(contents);
              return 11;
            }
          }
        }

        /* Allocate a part for that file. */
        part = curl_mime_addpart(subparts);
        if(!part) {
          warnf(config->global, "curl_mime_addpart failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          curl_slist_free_all(headers);
          Curl_safefree(contents);
          return 12;
        }

        /* Set part headers. */
        if(curl_mime_headers(part, headers, 1)) {
          warnf(config->global, "curl_mime_headers failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          curl_slist_free_all(headers);
          Curl_safefree(contents);
          return 13;
        }

        /* Setup file in part. */
        res = file_or_stdin(part, data);
        if(res) {
          warnf(config->global, "setting file %s  failed!\n", data);
          if(res != CURLE_READ_ERROR) {
            if(subparts != *mimecurrent)
              curl_mime_free(subparts);
            Curl_safefree(contents);
            return 14;
          }
        }
        if(filename && curl_mime_filename(part, filename)) {
          warnf(config->global, "curl_mime_filename failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          Curl_safefree(contents);
          return 15;
        }
        if(curl_mime_type(part, type)) {
          warnf(config->global, "curl_mime_type failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          Curl_safefree(contents);
          return 16;
        }
        if(curl_mime_encoder(part, encoder)) {
          warnf(config->global, "curl_mime_encoder failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          Curl_safefree(contents);
          return 17;
        }

        /* *contp could be '\0', so we just check with the delimiter */
      } while(sep); /* loop if there's another file name */

      /* now we add the multiple files section */
      if(subparts != *mimecurrent) {
        part = curl_mime_addpart(*mimecurrent);
        if(!part) {
          warnf(config->global, "curl_mime_addpart failed!\n");
          curl_mime_free(subparts);
          Curl_safefree(contents);
          return 18;
        }
        if(curl_mime_subparts(part, subparts)) {
          warnf(config->global, "curl_mime_subparts failed!\n");
          curl_mime_free(subparts);
          Curl_safefree(contents);
          return 19;
        }
      }
    }
    else {
        /* Allocate a mime part. */
        part = curl_mime_addpart(*mimecurrent);
        if(!part) {
          warnf(config->global, "curl_mime_addpart failed!\n");
          Curl_safefree(contents);
          return 20;
        }

      if(*contp == '<' && !literal_value) {
        ++contp;
        sep = get_param_part(config, '\0', &contp,
                             &data, &type, NULL, &encoder, &headers);
        if(sep < 0) {
          Curl_safefree(contents);
          return 21;
        }

        /* Set part headers. */
        if(curl_mime_headers(part, headers, 1)) {
          warnf(config->global, "curl_mime_headers failed!\n");
          curl_slist_free_all(headers);
          Curl_safefree(contents);
          return 22;
        }

        /* Setup file in part. */
        res = file_or_stdin(part, data);
        if(res) {
          warnf(config->global, "setting file %s failed!\n", data);
          if(res != CURLE_READ_ERROR) {
            Curl_safefree(contents);
            return 23;
          }
        }
      }
      else {
        if(literal_value)
          data = contp;
        else {
          sep = get_param_part(config, '\0', &contp,
                               &data, &type, &filename, &encoder, &headers);
          if(sep < 0) {
            Curl_safefree(contents);
            return 24;
          }
        }

        /* Set part headers. */
        if(curl_mime_headers(part, headers, 1)) {
          warnf(config->global, "curl_mime_headers failed!\n");
          curl_slist_free_all(headers);
          Curl_safefree(contents);
          return 25;
        }

#ifdef CURL_DOES_CONVERSIONS
        if(convert_to_network(data, strlen(data))) {
          warnf(config->global, "curl_formadd failed!\n");
          Curl_safefree(contents);
          return 26;
        }
#endif

        if(curl_mime_data(part, data, CURL_ZERO_TERMINATED)) {
          warnf(config->global, "curl_mime_data failed!\n");
          Curl_safefree(contents);
          return 27;
        }
      }

      if(curl_mime_filename(part, filename)) {
        warnf(config->global, "curl_mime_filename failed!\n");
        Curl_safefree(contents);
        return 28;
      }
      if(curl_mime_type(part, type)) {
        warnf(config->global, "curl_mime_type failed!\n");
        Curl_safefree(contents);
        return 29;
      }
      if(curl_mime_encoder(part, encoder)) {
        warnf(config->global, "curl_mime_encoder failed!\n");
        Curl_safefree(contents);
        return 30;
      }

      if(sep) {
        *contp = (char) sep;
        warnf(config->global,
              "garbage at end of field specification: %s\n", contp);
      }
    }

    /* Set part name. */
    if(name && curl_mime_name(part, name)) {
      warnf(config->global, "curl_mime_name failed!\n");
      Curl_safefree(contents);
      return 31;
    }
  }
  else {
    warnf(config->global, "Illegally formatted input field!\n");
    Curl_safefree(contents);
    return 32;
  }
  Curl_safefree(contents);
  return 0;
}